

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_job_help.hh
# Opt level: O0

void add_help_6(QPDFArgParser *ap)

{
  QPDFArgParser *pQVar1;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  allocator<char> local_ae1;
  string local_ae0;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  allocator<char> local_a69;
  string local_a68;
  allocator<char> local_a41;
  string local_a40;
  allocator<char> local_a19;
  string local_a18;
  allocator<char> local_9f1;
  string local_9f0;
  allocator<char> local_9c9;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  allocator<char> local_979;
  string local_978;
  allocator<char> local_951;
  string local_950;
  allocator<char> local_929;
  string local_928;
  allocator<char> local_901;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  string local_888;
  allocator<char> local_861;
  string local_860;
  allocator<char> local_839;
  string local_838;
  allocator<char> local_811;
  string local_810;
  allocator<char> local_7e9;
  string local_7e8;
  allocator<char> local_7c1;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  allocator<char> local_6f9;
  string local_6f8;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  allocator<char> local_681;
  string local_680;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  allocator<char> local_5b9;
  string local_5b8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  allocator<char> local_3d9;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  allocator<char> local_361;
  string local_360;
  allocator<char> local_339;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *ap_local;
  
  local_10 = ap;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"--allow-insecure",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"encryption",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"allow empty owner passwords",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,
             "Allow creation of PDF files with empty owner passwords and\nnon-empty user passwords when using 256-bit encryption.\n"
             ,&local_b9);
  QPDFArgParser::addOptionHelp(ap,&local_30,&local_68,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"--force-V4",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"encryption",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"force V=4 in encryption dictionary",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,
             "This option is for testing and is never needed in practice since\nqpdf does this automatically when needed.\n"
             ,&local_159);
  QPDFArgParser::addOptionHelp(pQVar1,&local_e0,&local_108,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"--force-R5",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"encryption",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"use unsupported R=5 encryption",&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "Use an undocumented, unsupported, deprecated encryption\nalgorithm that existed only in Acrobat version IX. This option\nshould not be used except for compatibility testing.\n"
             ,&local_1f9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_180,&local_1a8,&local_1d0,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"page-selection",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,"select pages from one or more files",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "Use the --pages option to select pages from multiple files. Usage:\n\nqpdf in.pdf --pages --file=input-file \\\n    [--range=page-range] [--password=password] [...] -- out.pdf\n\nOR\n\nqpdf in.pdf --pages input-file [--password=password] [page-range] \\\n    [...] -- out.pdf\n\nBetween --pages and the -- that terminates pages option, repeat\nthe following:\n\n--file=filename [--range=page-range] [--password=password] [options]\n\nFor compatibility, the file and range can be specified\npositionally. qpdf versions prior to 11.9.0\nrequire --password=password to immediately follow the filename. In\nthe older syntax, repeat the following:\n\nfilename [--password=password] [page-range]\n\nDocument-level information, such as outlines, tags, etc., is taken\nfrom in.pdf and is preserved in out.pdf. You can use --empty in place\nof an input file to start from an empty file and just copy pages\nequally from all files. You can use \".\" as a shorthand for the\nprimary input file (if not --empty). In the above example, \".\"\nwould refer to in.pdf.\n\nUse --password=password to specify the password for a\npassword-protected input file. If the same input file is used more\nthan once, you only need to supply the password the first time. If\nthe page range is omitted, all pages are selected.\n\nRun qpdf --help=page-ranges for help with page ranges.\n\nUse --collate=n to cause pages to be collated in groups of n pages\n(default 1) instead of concatenating the input.\nUse --collate=i,j,k,... to take i from the first, then j from the\nsecond, then k from the third, then i from the first, etc.\n\nExamples:\n\n- Start with in.pdf and append all pages from a.pdf and the even\n  pages from b.pdf, and write the output to out.pdf. Document-level\n  information from in.pdf is retained. Note the use of \".\" to refer\n  to in.pdf.\n\n  qpdf in.pdf --pages . a.pdf b.pdf 1-z:even -- out.pdf\n\n- Take all the pages from a.pdf, all the pages from b.pdf in\n  reverse, and only pages 3 and 6 from c.pdf and write the result\n  to out.pdf. Use password \"x\" to open b.pdf:\n\n  qpdf --empty --pages a.pdf b.pd..." /* TRUNCATED STRING LITERAL */
             ,&local_271);
  QPDFArgParser::addHelpTopic(pQVar1,&local_220,&local_248,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"overlay-underlay",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"overlay/underlay pages from other PDF files",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "These options allow pages from another PDF file to be overlaid or\nunderlaid on the primary output. Overlaid pages are drawn on top of\nthe destination page and may obscure the page. Underlaid pages are\ndrawn below the destination page. Usage:\n\n{--overlay|--underlay} [--file=]file\n      [--password=password]\n      [--to=page-range]\n      [--from=[page-range]]\n      [--repeat=page-range]\n      --\n\nNote the use of \"--\" by itself to terminate overlay/underlay options.\n\nFor overlay and underlay, a file and optional password are specified, along\nwith a series of optional page ranges. The default behavior is that each\npage of the overlay or underlay file is imposed on the corresponding page\nof the primary output until it runs out of pages, and any extra pages are\nignored. You can also give a page range with --repeat to cause\nthose pages to be repeated after the original pages are exhausted.\n\nThis options are repeatable. Pages will be stacked in order of\nappearance: first underlays, then the original page, then overlays.\n\nRun qpdf --help=page-ranges for help with page ranges.\n"
             ,&local_2e9);
  QPDFArgParser::addHelpTopic(pQVar1,&local_298,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"--to",&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"overlay-underlay",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,"destination pages for underlay/overlay",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,
             "--to=page-range\n\nSpecify the range of pages in the primary output to apply\noverlay/underlay to. See qpdf --help=page-ranges for help with\nthe page range syntax.\n"
             ,&local_389);
  QPDFArgParser::addOptionHelp(pQVar1,&local_310,&local_338,&local_360,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator(&local_361);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator(&local_311);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"--from",&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d8,"overlay-underlay",&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"source pages for underlay/overlay",&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,
             "--from=[page-range]\n\nSpecify pages from the overlay/underlay file that are applied to\nthe destination pages. See qpdf --help=page-ranges for help\nwith the page range syntax. The page range may be omitted\nif --repeat is used.\n"
             ,&local_429);
  QPDFArgParser::addOptionHelp(pQVar1,&local_3b0,&local_3d8,&local_400,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::allocator<char>::~allocator(&local_3d9);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"--repeat",&local_451);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"overlay-underlay",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4a0,"overlay/underlay pages to repeat",&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c8,
             "--repeat=page-range\n\nSpecify pages from the overlay/underlay that are repeated after\n\"from\" pages have been exhausted. See qpdf --help=page-ranges\nfor help with the page range syntax.\n"
             ,&local_4c9);
  QPDFArgParser::addOptionHelp(pQVar1,&local_450,&local_478,&local_4a0,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator(&local_479);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"attachments",&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"work with embedded files",&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_540,
             "It is possible to list, add, or delete embedded files (also known\nas attachments) and to copy attachments from other files. See help\non individual options for details. Run qpdf --help=add-attachment\nfor additional details about adding attachments. See also\n--help=--list-attachments and --help=--show-attachment.\n"
             ,&local_541);
  QPDFArgParser::addHelpTopic(pQVar1,&local_4f0,&local_518,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator(&local_541);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator(&local_4f1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"--add-attachment",&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"attachments",&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"start add attachment options",&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e0,
             "--add-attachment file [options] --\n\nThe --add-attachment flag and its options may be repeated to add\nmultiple attachments. Run qpdf --help=add-attachment for details.\n"
             ,&local_5e1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_568,&local_590,&local_5b8,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"--copy-attachments-from",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"attachments",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"start copy attachment options",&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,
             "--copy-attachments-from file [options] --\n\nThe --copy-attachments-from flag and its options may be repeated\nto copy attachments from multiple files. Run\nqpdf --help=copy-attachments for details.\n"
             ,&local_681);
  QPDFArgParser::addOptionHelp(pQVar1,&local_608,&local_630,&local_658,&local_680);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a8,"--remove-attachment",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d0,"attachments",&local_6d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"remove an embedded file",&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_720,
             "--remove-attachment=key\n\nRemove an embedded file using its key. Get the key with\n--list-attachments.\n"
             ,&local_721);
  QPDFArgParser::addOptionHelp(pQVar1,&local_6a8,&local_6d0,&local_6f8,&local_720);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator(&local_6f9);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"pdf-dates",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"PDF date format",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,
             "When a date is required, the date should conform to the PDF date\nformat specification, which is \"D:yyyymmddhhmmssz\" where \"z\" is\neither literally upper case \"Z\" for UTC or a timezone offset in\nthe form \"-hh\'mm\'\" or \"+hh\'mm\'\". Negative timezone offsets indicate\ntime before UTC. Positive offsets indicate how far after. For\nexample, US Eastern Standard Time (America/New_York) is \"-05\'00\'\",\nand Indian Standard Time (Asia/Calcutta) is \"+05\'30\'\".\n\nExamples:\n- D:20210207161528-05\'00\'   February 7, 2021 at 4:15:28 p.m.\n- D:20210207211528Z         February 7, 2021 at 21:15:28 UTC\n"
             ,&local_799);
  QPDFArgParser::addHelpTopic(pQVar1,&local_748,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7c0,"add-attachment",&local_7c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"attach (embed) files",&local_7e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_810,
             "The options listed below appear between --add-attachment and its\nterminating \"--\".\n"
             ,&local_811);
  QPDFArgParser::addHelpTopic(pQVar1,&local_7c0,&local_7e8,&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  std::allocator<char>::~allocator(&local_811);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::allocator<char>::~allocator(&local_7e9);
  std::__cxx11::string::~string((string *)&local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_838,"--key",&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_860,"add-attachment",&local_861);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"specify attachment key",&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,
             "--key=key\n\nSpecify the key to use for the attachment in the embedded files\ntable. It defaults to the last element (basename) of the\nattached file\'s filename.\n"
             ,&local_8b1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_838,&local_860,&local_888,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d8,"--filename",&local_8d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_900,"add-attachment",&local_901);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_928,"set attachment\'s displayed filename",&local_929);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,
             "--filename=name\n\nSpecify the filename to be used for the attachment. This is what\nis usually displayed to the user and is the name most graphical\nPDF viewers will use when saving a file. It defaults to the last\nelement (basename) of the attached file\'s filename.\n"
             ,&local_951);
  QPDFArgParser::addOptionHelp(pQVar1,&local_8d8,&local_900,&local_928,&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator(&local_951);
  std::__cxx11::string::~string((string *)&local_928);
  std::allocator<char>::~allocator(&local_929);
  std::__cxx11::string::~string((string *)&local_900);
  std::allocator<char>::~allocator(&local_901);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"--creationdate",&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9a0,"add-attachment",&local_9a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"set attachment\'s creation date",&local_9c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,
             "--creationdate=date\n\nSpecify the attachment\'s creation date in PDF format; defaults\nto the current time. Run qpdf --help=pdf-dates for information\nabout the date format.\n"
             ,&local_9f1);
  QPDFArgParser::addOptionHelp(pQVar1,&local_978,&local_9a0,&local_9c8,&local_9f0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::allocator<char>::~allocator(&local_9f1);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string((string *)&local_978);
  std::allocator<char>::~allocator(&local_979);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a18,"--moddate",&local_a19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"add-attachment",&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a68,"set attachment\'s modification date",&local_a69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,
             "--moddate=date\n\nSpecify the attachment\'s modification date in PDF format;\ndefaults to the current time. Run qpdf --help=pdf-dates for\ninformation about the date format.\n"
             ,&local_a91);
  QPDFArgParser::addOptionHelp(pQVar1,&local_a18,&local_a40,&local_a68,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  std::__cxx11::string::~string((string *)&local_a68);
  std::allocator<char>::~allocator(&local_a69);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::__cxx11::string::~string((string *)&local_a18);
  std::allocator<char>::~allocator(&local_a19);
  pQVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab8,"--mimetype",&local_ab9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae0,"add-attachment",&local_ae1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b08,"attachment mime type, e.g. application/pdf",&local_b09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b30,
             "--mimetype=type/subtype\n\nSpecify the mime type for the attachment, such as text/plain,\napplication/pdf, image/png, etc.\n"
             ,&local_b31);
  QPDFArgParser::addOptionHelp(pQVar1,&local_ab8,&local_ae0,&local_b08,&local_b30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::allocator<char>::~allocator(&local_b31);
  std::__cxx11::string::~string((string *)&local_b08);
  std::allocator<char>::~allocator(&local_b09);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::allocator<char>::~allocator(&local_ae1);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  return;
}

Assistant:

static void add_help_6(QPDFArgParser& ap)
{
ap.addOptionHelp("--allow-insecure", "encryption", "allow empty owner passwords", R"(Allow creation of PDF files with empty owner passwords and
non-empty user passwords when using 256-bit encryption.
)");
ap.addOptionHelp("--force-V4", "encryption", "force V=4 in encryption dictionary", R"(This option is for testing and is never needed in practice since
qpdf does this automatically when needed.
)");
ap.addOptionHelp("--force-R5", "encryption", "use unsupported R=5 encryption", R"(Use an undocumented, unsupported, deprecated encryption
algorithm that existed only in Acrobat version IX. This option
should not be used except for compatibility testing.
)");
ap.addHelpTopic("page-selection", "select pages from one or more files", R"(Use the --pages option to select pages from multiple files. Usage:

qpdf in.pdf --pages --file=input-file \
    [--range=page-range] [--password=password] [...] -- out.pdf

OR

qpdf in.pdf --pages input-file [--password=password] [page-range] \
    [...] -- out.pdf

Between --pages and the -- that terminates pages option, repeat
the following:

--file=filename [--range=page-range] [--password=password] [options]

For compatibility, the file and range can be specified
positionally. qpdf versions prior to 11.9.0
require --password=password to immediately follow the filename. In
the older syntax, repeat the following:

filename [--password=password] [page-range]

Document-level information, such as outlines, tags, etc., is taken
from in.pdf and is preserved in out.pdf. You can use --empty in place
of an input file to start from an empty file and just copy pages
equally from all files. You can use "." as a shorthand for the
primary input file (if not --empty). In the above example, "."
would refer to in.pdf.

Use --password=password to specify the password for a
password-protected input file. If the same input file is used more
than once, you only need to supply the password the first time. If
the page range is omitted, all pages are selected.

Run qpdf --help=page-ranges for help with page ranges.

Use --collate=n to cause pages to be collated in groups of n pages
(default 1) instead of concatenating the input.
Use --collate=i,j,k,... to take i from the first, then j from the
second, then k from the third, then i from the first, etc.

Examples:

- Start with in.pdf and append all pages from a.pdf and the even
  pages from b.pdf, and write the output to out.pdf. Document-level
  information from in.pdf is retained. Note the use of "." to refer
  to in.pdf.

  qpdf in.pdf --pages . a.pdf b.pdf 1-z:even -- out.pdf

- Take all the pages from a.pdf, all the pages from b.pdf in
  reverse, and only pages 3 and 6 from c.pdf and write the result
  to out.pdf. Use password "x" to open b.pdf:

  qpdf --empty --pages a.pdf b.pdf --password=x z-1 c.pdf 3,6

More examples are in the manual.
)");
ap.addHelpTopic("overlay-underlay", "overlay/underlay pages from other PDF files", R"(These options allow pages from another PDF file to be overlaid or
underlaid on the primary output. Overlaid pages are drawn on top of
the destination page and may obscure the page. Underlaid pages are
drawn below the destination page. Usage:

{--overlay|--underlay} [--file=]file
      [--password=password]
      [--to=page-range]
      [--from=[page-range]]
      [--repeat=page-range]
      --

Note the use of "--" by itself to terminate overlay/underlay options.

For overlay and underlay, a file and optional password are specified, along
with a series of optional page ranges. The default behavior is that each
page of the overlay or underlay file is imposed on the corresponding page
of the primary output until it runs out of pages, and any extra pages are
ignored. You can also give a page range with --repeat to cause
those pages to be repeated after the original pages are exhausted.

This options are repeatable. Pages will be stacked in order of
appearance: first underlays, then the original page, then overlays.

Run qpdf --help=page-ranges for help with page ranges.
)");
ap.addOptionHelp("--to", "overlay-underlay", "destination pages for underlay/overlay", R"(--to=page-range

Specify the range of pages in the primary output to apply
overlay/underlay to. See qpdf --help=page-ranges for help with
the page range syntax.
)");
ap.addOptionHelp("--from", "overlay-underlay", "source pages for underlay/overlay", R"(--from=[page-range]

Specify pages from the overlay/underlay file that are applied to
the destination pages. See qpdf --help=page-ranges for help
with the page range syntax. The page range may be omitted
if --repeat is used.
)");
ap.addOptionHelp("--repeat", "overlay-underlay", "overlay/underlay pages to repeat", R"(--repeat=page-range

Specify pages from the overlay/underlay that are repeated after
"from" pages have been exhausted. See qpdf --help=page-ranges
for help with the page range syntax.
)");
ap.addHelpTopic("attachments", "work with embedded files", R"(It is possible to list, add, or delete embedded files (also known
as attachments) and to copy attachments from other files. See help
on individual options for details. Run qpdf --help=add-attachment
for additional details about adding attachments. See also
--help=--list-attachments and --help=--show-attachment.
)");
ap.addOptionHelp("--add-attachment", "attachments", "start add attachment options", R"(--add-attachment file [options] --

The --add-attachment flag and its options may be repeated to add
multiple attachments. Run qpdf --help=add-attachment for details.
)");
ap.addOptionHelp("--copy-attachments-from", "attachments", "start copy attachment options", R"(--copy-attachments-from file [options] --

The --copy-attachments-from flag and its options may be repeated
to copy attachments from multiple files. Run
qpdf --help=copy-attachments for details.
)");
ap.addOptionHelp("--remove-attachment", "attachments", "remove an embedded file", R"(--remove-attachment=key

Remove an embedded file using its key. Get the key with
--list-attachments.
)");
ap.addHelpTopic("pdf-dates", "PDF date format", R"(When a date is required, the date should conform to the PDF date
format specification, which is "D:yyyymmddhhmmssz" where "z" is
either literally upper case "Z" for UTC or a timezone offset in
the form "-hh'mm'" or "+hh'mm'". Negative timezone offsets indicate
time before UTC. Positive offsets indicate how far after. For
example, US Eastern Standard Time (America/New_York) is "-05'00'",
and Indian Standard Time (Asia/Calcutta) is "+05'30'".

Examples:
- D:20210207161528-05'00'   February 7, 2021 at 4:15:28 p.m.
- D:20210207211528Z         February 7, 2021 at 21:15:28 UTC
)");
ap.addHelpTopic("add-attachment", "attach (embed) files", R"(The options listed below appear between --add-attachment and its
terminating "--".
)");
ap.addOptionHelp("--key", "add-attachment", "specify attachment key", R"(--key=key

Specify the key to use for the attachment in the embedded files
table. It defaults to the last element (basename) of the
attached file's filename.
)");
ap.addOptionHelp("--filename", "add-attachment", "set attachment's displayed filename", R"(--filename=name

Specify the filename to be used for the attachment. This is what
is usually displayed to the user and is the name most graphical
PDF viewers will use when saving a file. It defaults to the last
element (basename) of the attached file's filename.
)");
ap.addOptionHelp("--creationdate", "add-attachment", "set attachment's creation date", R"(--creationdate=date

Specify the attachment's creation date in PDF format; defaults
to the current time. Run qpdf --help=pdf-dates for information
about the date format.
)");
ap.addOptionHelp("--moddate", "add-attachment", "set attachment's modification date", R"(--moddate=date

Specify the attachment's modification date in PDF format;
defaults to the current time. Run qpdf --help=pdf-dates for
information about the date format.
)");
ap.addOptionHelp("--mimetype", "add-attachment", "attachment mime type, e.g. application/pdf", R"(--mimetype=type/subtype

Specify the mime type for the attachment, such as text/plain,
application/pdf, image/png, etc.
)");
}